

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPTrap.h
# Opt level: O0

bool __thiscall SNMPTrap::buildForSending(SNMPTrap *this)

{
  int iVar1;
  snmp_request_id_t RequestId;
  SNMPTrap *this_local;
  
  RequestId = SNMPPacket::generate_request_id();
  SNMPPacket::setRequestID(&this->super_SNMPPacket,RequestId);
  if ((this->super_SNMPPacket).snmpVersion == SNMP_VERSION_1) {
    iVar1 = (*(this->super_SNMPPacket)._vptr_SNMPPacket[2])();
    this_local._7_1_ = (bool)((byte)iVar1 & 1);
  }
  else {
    this_local._7_1_ = SNMPPacket::build(&this->super_SNMPPacket);
  }
  return this_local._7_1_;
}

Assistant:

bool buildForSending(){
        // This is the start of a fresh send, we're going to reset our requestID, and build the packet
        this->setRequestID(SNMPPacket::generate_request_id());

        // Flow for v2Trap/v2Inform is SNMPPacket::build()  -> SNMPTrap::generateVarBindList() -> v2 logic
        // flow for v1Trap is          SNMPTrap::build()    -> SNMPTrap::generateVarBindList() -> v1 logic

        if(this->snmpVersion == SNMP_VERSION_1){
            // Version 1 needs a special structure, so we overwrite the building part
            return this->build();
        } else {
            // Version 2 will use regular packet building but call back our generateVarBindList, so we can still use callbacks
            return SNMPPacket::build();
        }
    }